

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primes.cpp
# Opt level: O1

bool findPrimePower(int q,int *p,int *n)

{
  bool bVar1;
  int iVar2;
  uint n_00;
  ulong uVar3;
  double dVar4;
  double __x;
  
  bVar1 = false;
  *n = 0;
  *p = 0;
  if (1 < q) {
    bVar1 = isPrime(q);
    if (bVar1) {
      *p = q;
      *n = 1;
    }
    else {
      __x = (double)(q + 1);
      if (__x < 0.0) {
        dVar4 = sqrt(__x);
      }
      else {
        dVar4 = SQRT(__x);
      }
      if (2.0 < dVar4) {
        uVar3 = 2;
        do {
          n_00 = (uint)uVar3;
          if ((int)((ulong)(uint)q % uVar3) == 0) goto LAB_0010ad15;
          dVar4 = SQRT(__x);
          if (__x < 0.0) {
            dVar4 = sqrt(__x);
          }
          uVar3 = (ulong)(n_00 + 1);
        } while ((double)(int)(n_00 + 1) < dVar4);
      }
      n_00 = 0;
LAB_0010ad15:
      bVar1 = isPrime(n_00);
      if (!bVar1) {
        return false;
      }
      do {
        iVar2 = q / (int)n_00;
        if (q % (int)n_00 != 0) {
          return false;
        }
        *n = *n + 1;
        q = iVar2;
      } while (iVar2 != 1);
      *p = n_00;
    }
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool findPrimePower(int q, int* p, int* n)
{
    int firstfactor = 0;
    *p = *n = 0;

    if (q <= 1)
        return false;

    if (isPrime(q))
    {
        *p = q;
        *n = 1;
        return true;
    }

    for (int k = 2; k < sqrt(double(q) + 1.0); k++)
    {
        if ((q % k) == 0)
        {
            firstfactor = k;
            break;
        }
    }

    if (!isPrime(firstfactor))
        return false;

    while (true)
    {
        if (q == 1)
        {
            *p = firstfactor;
            return true;
        }
        if (q % firstfactor == 0)
        {
            *n += 1;
            q /= firstfactor;
        }
        else
            return false;
    }
}